

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O0

void runpush(runcxdef *ctx,dattyp typ,runsdef *val)

{
  undefined8 *puVar1;
  uint uVar2;
  undefined8 *in_RDX;
  int in_ESI;
  long in_RDI;
  int len;
  runsdef *in_stack_00000030;
  runsdef *in_stack_00000038;
  runsdef *in_stack_00000040;
  uint in_stack_00000048;
  uint in_stack_0000004c;
  runcxdef *in_stack_00000050;
  
  puVar1 = *(undefined8 **)(in_RDI + 0x20);
  *puVar1 = *in_RDX;
  puVar1[1] = in_RDX[1];
  **(undefined1 **)(in_RDI + 0x20) = (char)in_ESI;
  if ((in_ESI == 3) || (in_ESI == 7)) {
    uVar2 = osrp2((void *)in_RDX[1]);
    if ((uint)((int)*(undefined8 *)(in_RDI + 0x40) - (int)*(undefined8 *)(in_RDI + 0x38)) <= uVar2)
    {
      runhcmp(in_stack_00000050,in_stack_0000004c,in_stack_00000048,in_stack_00000040,
              in_stack_00000038,in_stack_00000030);
    }
    memcpy(*(void **)(in_RDI + 0x38),(void *)in_RDX[1],(long)(int)uVar2);
    *(undefined8 *)(*(long *)(in_RDI + 0x20) + 8) = *(undefined8 *)(in_RDI + 0x38);
    *(long *)(in_RDI + 0x38) = *(long *)(in_RDI + 0x38) + (long)(int)uVar2;
  }
  *(long *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) + 0x10;
  return;
}

Assistant:

void runpush(runcxdef *ctx, dattyp typ, runsdef *val)
{
    int len;

    /* check for stack overflow */
    runstkovf(ctx);
    
    OSCPYSTRUCT(*(ctx->runcxsp), *val);
    ctx->runcxsp->runstyp = typ;

    /* variable-length data must be copied into the heap */
    if (typ == DAT_SSTRING || typ == DAT_LIST)
    {
        len = osrp2(val->runsv.runsvstr);
        runhres(ctx, len, 0);                      /* reserve space in heap */
        memcpy(ctx->runcxhp, val->runsv.runsvstr, (size_t)len);
        ctx->runcxsp->runsv.runsvstr = ctx->runcxhp;
        ctx->runcxhp += len;
    }
    
    /* increment stack pointer */
    ++(ctx->runcxsp);
}